

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

void Saig_BmcManStop(Saig_Bmc_t *p)

{
  Saig_Bmc_t *p_local;
  
  Aig_ManStop(p->pFrm);
  Vec_VecFree((Vec_Vec_t *)p->vAig2Frm);
  Vec_IntFree(p->vObj2Var);
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->pSat2 != (satoko_t *)0x0) {
    satoko_destroy(p->pSat2);
  }
  Vec_PtrFree(p->vTargets);
  Vec_IntFree(p->vVisited);
  if (p != (Saig_Bmc_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Saig_BmcManStop( Saig_Bmc_t * p )
{
    Aig_ManStop( p->pFrm  );
    Vec_VecFree( (Vec_Vec_t *)p->vAig2Frm );
    Vec_IntFree( p->vObj2Var );
    if ( p->pSat )  sat_solver_delete( p->pSat );
    if ( p->pSat2 ) satoko_destroy( p->pSat2 );
    Vec_PtrFree( p->vTargets );
    Vec_IntFree( p->vVisited );
    ABC_FREE( p );
}